

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

RecyclableObject *
Js::JavascriptOperators::GetIteratorFunction
          (RecyclableObject *instance,ScriptContext *scriptContext,bool optional)

{
  bool bVar1;
  BOOL BVar2;
  Var in_RAX;
  RecyclableObject *pRVar3;
  undefined7 in_register_00000011;
  Var local_28;
  Var value;
  
  local_28 = in_RAX;
  GetProperty_InternalSimple(instance,instance,0x14,&local_28,scriptContext);
  if (((int)CONCAT71(in_register_00000011,optional) != 0) &&
     (BVar2 = IsUndefinedOrNull(local_28), BVar2 != 0)) {
    return (RecyclableObject *)0x0;
  }
  bVar1 = JavascriptConversion::IsCallable(local_28);
  if (bVar1) {
    pRVar3 = VarTo<Js::RecyclableObject>(local_28);
    return pRVar3;
  }
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec45,(PCWSTR)0x0);
}

Assistant:

RecyclableObject* JavascriptOperators::GetIteratorFunction(RecyclableObject* instance, ScriptContext * scriptContext, bool optional)
    {
        Var func = JavascriptOperators::GetPropertyNoCache(instance, PropertyIds::_symbolIterator, scriptContext);

        if (optional && JavascriptOperators::IsUndefinedOrNull(func))
        {
            return nullptr;
        }

        if (!JavascriptConversion::IsCallable(func))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_NeedFunction);
        }

        RecyclableObject* function = VarTo<RecyclableObject>(func);
        return function;
    }